

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
::internal_upper_bound<long>
          (btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
           *this,long *key)

{
  byte bVar1;
  bool bVar2;
  slot_type *psVar3;
  btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
  *this_00;
  ulong i;
  ulong uVar4;
  iterator iVar5;
  
  this_00 = (this->root_).
            super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
            .
            super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*,_false>
            ._M_head_impl;
  do {
    bVar1 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
            ::count(this_00);
    uVar4 = (ulong)bVar1;
    for (i = 0; uVar4 != i; i = i + 1) {
      psVar3 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
               ::slot(this_00,i);
      if (*key < *psVar3) {
        uVar4 = i & 0xffffffff;
        break;
      }
    }
    bVar2 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
            ::leaf(this_00);
    if (bVar2) break;
    this_00 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
              ::child(this_00,(long)(int)uVar4);
  } while( true );
  while( true ) {
    bVar1 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
            ::position(this_00);
    uVar4 = (ulong)bVar1;
    this_00 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
              ::parent(this_00);
    bVar2 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
            ::leaf(this_00);
    if (bVar2) break;
    bVar1 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
            ::count(this_00);
    if ((uint)uVar4 != (uint)bVar1) goto LAB_00153b12;
  }
  this_00 = (btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
             *)0x0;
LAB_00153b12:
  iVar5._8_8_ = uVar4;
  iVar5.node = this_00;
  return iVar5;
}

Assistant:

auto btree<P>::internal_upper_bound(const K &key) const -> iterator {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            iter.position = iter.node->upper_bound(key, key_comp());
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return internal_last(iter);
    }